

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

ARMCPU * cpu_arm_init_arm(uc_struct_conflict1 *uc)

{
  ARMCPUClass *k;
  byte *pbVar1;
  uint64_t *puVar2;
  uc_mode uVar3;
  ARMCPU *cs;
  long lVar4;
  uc_struct_conflict1 *uc_00;
  ARMCPU *uc_01;
  
  cs = (ARMCPU *)calloc(1,0xb720);
  if (cs == (ARMCPU *)0x0) {
    return (ARMCPU *)0x0;
  }
  uVar3 = uc->mode;
  if ((uVar3 & UC_MODE_MCLASS) == UC_MODE_ARM) {
    if ((char)uVar3 < '\0') {
      uc->cpu_model = 0;
    }
    else if ((uVar3 >> 8 & 1) == 0) {
      if ((uVar3 >> 9 & 1) == 0) {
        if (uc->cpu_model != 0x7fffffff) {
          if (0x21 < (uint)uc->cpu_model) {
            free(cs);
            return (ARMCPU *)0x0;
          }
          goto LAB_00528dad;
        }
        if ((uVar3 >> 0x1e & 1) == 0) {
          uc->cpu_model = 0x11;
          goto LAB_00528dad;
        }
      }
      uc->cpu_model = 5;
    }
    else {
      uc->cpu_model = 1;
    }
  }
  else {
    uc->cpu_model = 0xb;
  }
LAB_00528dad:
  k = &cs->cc;
  (cs->parent_obj).cc = &k->parent_class;
  (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
  uc->cpu = (CPUState *)cs;
  uc_00 = uc;
  cpu_class_init((uc_struct *)uc,&k->parent_class);
  arm_cpu_class_init_arm(uc_00,&k->parent_class);
  cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
  arm_cpu_initfn_arm(uc,(CPUState *)cs);
  lVar4 = (long)uc->cpu_model;
  if (0xfffffffffffffffa < lVar4 - 0xcU) {
    (*arm_cpus[lVar4].class_init)(uc,&k->parent_class,uc);
    lVar4 = (long)uc->cpu_model;
  }
  (*arm_cpus[lVar4].initfn)(uc,(CPUState *)cs);
  uc_01 = cs;
  arm_cpu_post_init_arm((CPUState *)cs);
  arm_cpu_realizefn_arm((uc_struct_conflict1 *)uc_01,(CPUState *)cs);
  cpu_address_space_init_arm((CPUState *)cs,0,(cs->parent_obj).memory);
  qemu_init_vcpu_arm((CPUState *)cs);
  uVar3 = uc->mode;
  if (((uVar3 & (UC_MODE_BIG_ENDIAN|UC_MODE_ARMBE8)) != UC_MODE_ARM) &&
     (pbVar1 = (byte *)((long)&(cs->env).uncached_cpsr + 1), *pbVar1 = *pbVar1 | 2,
     (uVar3 >> 0x1e & 1) != 0)) {
    pbVar1 = (byte *)((long)&(cs->env).cp15.field_2 + 8);
    *pbVar1 = *pbVar1 | 0x80;
  }
  puVar2 = &(cs->env).cp15.scr_el3;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arm_rebuild_hflags_arm(&cs->env);
  return cs;
}

Assistant:

ARMCPU *cpu_arm_init(struct uc_struct *uc)
{
    ARMCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    CPUARMState *env;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#if !defined(TARGET_AARCH64)
    if (uc->mode & UC_MODE_MCLASS) {
        uc->cpu_model = UC_CPU_ARM_CORTEX_M33;
    } else if (uc->mode & UC_MODE_ARM926) {
        uc->cpu_model = UC_CPU_ARM_926;
    } else if (uc->mode & UC_MODE_ARM946) {
        uc->cpu_model = UC_CPU_ARM_946;
    } else if (uc->mode & UC_MODE_ARM1176) {
        uc->cpu_model = UC_CPU_ARM_1176;
    } else if (uc->cpu_model == INT_MAX) {
        if (uc->mode & UC_MODE_BIG_ENDIAN) {
            uc->cpu_model = UC_CPU_ARM_1176; // For BE32 mode.
        } else {
            uc->cpu_model = UC_CPU_ARM_CORTEX_A15; // cortex-a15
        }
    } else if (uc->cpu_model >= ARR_SIZE(arm_cpus)) {
        free(cpu);
        return NULL;
    }
#endif

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init ARMCPUClass */
    arm_cpu_class_init(uc, cc);

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init ARMCPU */
    arm_cpu_initfn(uc, cs);

#if !defined(TARGET_AARCH64)
    /* init ARM types */
    if (arm_cpus[uc->cpu_model].class_init) {
        arm_cpus[uc->cpu_model].class_init(uc, cc, uc);
    }
    if (arm_cpus[uc->cpu_model].initfn) {
        arm_cpus[uc->cpu_model].initfn(uc, cs);
    }
#endif

    /* postinit ARMCPU */
    arm_cpu_instance_init(cs);

    /* realize ARMCPU */
    arm_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    // UC_MODE_BIG_ENDIAN means big endian code and big endian data (BE32), which 
    // is only supported before ARMv7-A (and it only makes sense in qemu usermode!).
    //
    // UC_MODE_ARMBE8 & BE32 difference shouldn't exist in fact. We do this for
    // backward compatibility.
    //
    // UC_MODE_ARMBE8 -> little endian code, big endian data
    // UC_MODE_ARMBE8 | UC_MODE_BIG_ENDIAN -> big endian code, big endian data
    //
    // In QEMU system, all arm instruction fetch **should be** little endian, however
    // we hack it to support (usermode) BE32.
    //
    // Reference:
    // https://developer.arm.com/documentation/ddi0406/c/Application-Level-Architecture/Application-Level-Memory-Model/Endian-support/Instruction-endianness?lang=en
    // https://developer.arm.com/documentation/den0024/a/ARMv8-Registers/Endianness
    env = &cpu->env;
    if (uc->mode & UC_MODE_ARMBE8 || uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian data access.
        env->uncached_cpsr |= CPSR_E;
    }

    if (uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian code access.
        env->cp15.sctlr_ns |= SCTLR_B;
    }

    // Backward compatiblity, start arm CPU in non-secure state.
    env->cp15.scr_el3 |= SCR_NS;

    arm_rebuild_hflags(env);

    return cpu;
}